

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::CumulativeReporterBase::testGroupEnded
          (CumulativeReporterBase *this,TestGroupStats *testGroupStats)

{
  pointer pcVar1;
  pointer pPVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  size_t sVar5;
  pointer pPVar6;
  pointer pPVar7;
  pointer pPVar8;
  pointer pPVar9;
  size_t sVar10;
  size_t sVar11;
  Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
  *pNVar12;
  Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>
  node;
  value_type local_20;
  
  pNVar12 = (Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
             *)operator_new(0x88);
  (pNVar12->super_SharedImpl<Catch::IShared>).m_rc = 0;
  (pNVar12->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__Node_0016cb40;
  (pNVar12->value)._vptr_TestGroupStats = (_func_int **)&PTR__TestGroupStats_0016b330;
  (pNVar12->value).groupInfo.name._M_dataplus._M_p =
       (pointer)&(pNVar12->value).groupInfo.name.field_2;
  pcVar1 = (testGroupStats->groupInfo).name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(pNVar12->value).groupInfo,pcVar1,
             pcVar1 + (testGroupStats->groupInfo).name._M_string_length);
  sVar5 = (testGroupStats->groupInfo).groupsCounts;
  (pNVar12->value).groupInfo.groupIndex = (testGroupStats->groupInfo).groupIndex;
  (pNVar12->value).groupInfo.groupsCounts = sVar5;
  sVar5 = (testGroupStats->totals).assertions.failed;
  sVar10 = (testGroupStats->totals).testCases.passed;
  uVar3 = *(undefined4 *)((long)&(testGroupStats->totals).testCases.passed + 4);
  sVar11 = (testGroupStats->totals).testCases.failed;
  uVar4 = *(undefined4 *)((long)&(testGroupStats->totals).testCases.failed + 4);
  (pNVar12->value).totals.assertions.passed = (testGroupStats->totals).assertions.passed;
  (pNVar12->value).totals.assertions.failed = sVar5;
  *(int *)&(pNVar12->value).totals.testCases.passed = (int)sVar10;
  *(undefined4 *)((long)&(pNVar12->value).totals.testCases.passed + 4) = uVar3;
  *(int *)&(pNVar12->value).totals.testCases.failed = (int)sVar11;
  *(undefined4 *)((long)&(pNVar12->value).totals.testCases.failed + 4) = uVar4;
  (pNVar12->value).aborting = testGroupStats->aborting;
  (pNVar12->children).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pNVar12->children).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pNVar12->children).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_20.m_p = pNVar12;
  (*(pNVar12->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable[2]
  )(pNVar12);
  pPVar2 = (pNVar12->children).
           super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pPVar6 = (this->m_testCases).
           super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar7 = (this->m_testCases).
           super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (pNVar12->children).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->m_testCases).
       super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pPVar8 = (pNVar12->children).
           super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar9 = (pNVar12->children).
           super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (pNVar12->children).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pPVar6;
  (pNVar12->children).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pPVar7;
  (this->m_testCases).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pPVar8;
  (this->m_testCases).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pPVar9;
  (this->m_testCases).
  super__Vector_base<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pPVar2;
  std::
  vector<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>,_std::allocator<Catch::Ptr<Catch::CumulativeReporterBase::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
  ::push_back(&this->m_testGroups,&local_20);
  if (local_20.m_p !=
      (Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
       *)0x0) {
    (*((local_20.m_p)->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
      _vptr_NonCopyable[3])();
  }
  return;
}

Assistant:

virtual void testGroupEnded( TestGroupStats const& testGroupStats ) {
            Ptr<TestGroupNode> node = new TestGroupNode( testGroupStats );
            node->children.swap( m_testCases );
            m_testGroups.push_back( node );
        }